

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O2

int dwarf_dnames_name(Dwarf_Dnames_Head dn,Dwarf_Unsigned name_index,Dwarf_Unsigned *bucket_number,
                     Dwarf_Unsigned *hash_value,Dwarf_Unsigned *offset_to_debug_str,char **ptrtostr,
                     Dwarf_Unsigned *offset_in_entrypool,Dwarf_Unsigned *abbrev_code,
                     Dwarf_Half *abbrev_tag,Dwarf_Unsigned array_size,Dwarf_Half *idxattr_array,
                     Dwarf_Half *form_array,Dwarf_Unsigned *attr_count,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned *pDVar2;
  char *pcVar3;
  Dwarf_Signed errval;
  Dwarf_Small *strptr;
  Dwarf_Unsigned DVar4;
  Dwarf_Debug pDVar5;
  Dwarf_Small *pDVar6;
  Dwarf_D_Abbrev_s *pDVar7;
  ulong uVar8;
  Dwarf_Small *local_58;
  Dwarf_Unsigned hash_val;
  
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    pcVar3 = 
    "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() Passes in a NULL or uninitialized pointer";
  }
  else {
    pDVar5 = dn->dn_dbg;
    if ((pDVar5 != (Dwarf_Debug)0x0) && (pDVar5->de_magic == 0xebfdebfd)) {
      if (name_index == 0) {
        return -1;
      }
      if (dn->dn_name_count < name_index) {
        return -1;
      }
      if ((dn->dn_bucket_count != 0) && (dn->dn_bucket_array != (Dwarf_DN_Bucket_s *)0x0)) {
        pDVar2 = &dn->dn_bucket_array->db_collisioncount;
        for (DVar4 = 0; dn->dn_bucket_count != DVar4; DVar4 = DVar4 + 1) {
          if ((((Dwarf_DN_Bucket_s *)(pDVar2 + -1))->db_nameindex != 0) &&
             (name_index <= (((Dwarf_DN_Bucket_s *)(pDVar2 + -1))->db_nameindex - 1) + *pDVar2)) {
            *bucket_number = DVar4;
            hash_val = 0;
            if (dn->dn_bucket_count != 0) {
              local_58 = dn->dn_hash_table + name_index * 4 + -4;
              iVar1 = read_uword_val(pDVar5,&local_58,dn->dn_hash_table + dn->dn_name_count * 4 + 4,
                                     0x177,&hash_val,0xffffffff,error);
              if (iVar1 != 0) {
                return 1;
              }
              *hash_value = hash_val;
            }
            break;
          }
          pDVar2 = pDVar2 + 2;
        }
      }
      uVar8 = (ulong)dn->dn_offset_size;
      hash_val = 0;
      if (dn->dn_abbrevs < dn->dn_string_offsets + (name_index - 1) * uVar8 + uVar8) {
        pcVar3 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
        errval = 0x14b;
      }
      else {
        (*pDVar5->de_copy_word)(&hash_val,dn->dn_string_offsets + (name_index - 1) * uVar8,uVar8);
        if (offset_to_debug_str != (Dwarf_Unsigned *)0x0) {
          *offset_to_debug_str = hash_val;
        }
        pDVar6 = (pDVar5->de_debug_str).dss_data;
        strptr = pDVar6 + hash_val;
        iVar1 = _dwarf_check_string_valid
                          (pDVar5,pDVar6,strptr,pDVar6 + (pDVar5->de_debug_str).dss_size,0x169,error
                          );
        if (iVar1 != 0) {
          return iVar1;
        }
        if (ptrtostr != (char **)0x0) {
          *ptrtostr = (char *)strptr;
        }
        uVar8 = (ulong)dn->dn_offset_size;
        hash_val = 0;
        if (dn->dn_abbrevs < dn->dn_entry_offsets + (name_index - 1) * uVar8 + uVar8) {
          pcVar3 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          errval = 0x14b;
        }
        else {
          (*pDVar5->de_copy_word)(&hash_val,dn->dn_entry_offsets + (name_index - 1) * uVar8,uVar8);
          uVar8 = dn->dn_entry_pool_size;
          if (hash_val < uVar8) {
            if (offset_in_entrypool != (Dwarf_Unsigned *)0x0) {
              *offset_in_entrypool = hash_val;
              uVar8 = dn->dn_entry_pool_size;
            }
            if (hash_val < uVar8) {
              pDVar5 = dn->dn_dbg;
              pDVar6 = dn->dn_entry_pool + hash_val;
              hash_val = 0;
              local_58 = (Dwarf_Small *)0x0;
              iVar1 = dwarf_decode_leb128((char *)pDVar6,&hash_val,(Dwarf_Unsigned *)&local_58,
                                          (char *)(dn->dn_entry_pool + uVar8));
              pDVar6 = local_58;
              if (iVar1 != 1) {
                pDVar7 = dn->dn_abbrev_instances;
                DVar4 = 0;
                while( true ) {
                  if (DVar4 == dn->dn_abbrev_instance_count) {
                    pDVar5 = dn->dn_dbg;
                    dwarfstring_constructor((dwarfstring_s *)&hash_val);
                    dwarfstring_append_printf_u
                              ((dwarfstring_s *)&hash_val,
                               "DW_DLE_DEBUG_NAMES_ERROR: The abbrev code %u",(dwarfstring_u)pDVar6)
                    ;
                    dwarfstring_append_printf_u
                              ((dwarfstring_s *)&hash_val,"(0x%x) ",(dwarfstring_u)pDVar6);
                    dwarfstring_append((dwarfstring_s *)&hash_val,
                                       "from the entry pool is absent from the abbrev table.");
                    pcVar3 = dwarfstring_string((dwarfstring_s *)&hash_val);
                    _dwarf_error_string(pDVar5,error,0x1e4,pcVar3);
                    dwarfstring_destructor((dwarfstring_s *)&hash_val);
                    return 1;
                  }
                  if ((Dwarf_Small *)pDVar7->da_abbrev_code == local_58) break;
                  DVar4 = DVar4 + 1;
                  pDVar7 = pDVar7 + 1;
                }
                if (abbrev_code != (Dwarf_Unsigned *)0x0) {
                  *abbrev_code = (Dwarf_Unsigned)local_58;
                }
                if (abbrev_tag == (Dwarf_Half *)0x0 || local_58 == (Dwarf_Small *)0x0) {
                  if (local_58 == (Dwarf_Small *)0x0) {
                    return 0;
                  }
                }
                else {
                  *abbrev_tag = (Dwarf_Half)pDVar7->da_tag;
                }
                uVar8 = pDVar7->da_pairs_count;
                if (attr_count != (Dwarf_Unsigned *)0x0) {
                  *attr_count = uVar8;
                }
                if (uVar8 < array_size) {
                  array_size = uVar8;
                }
                for (uVar8 = 0; array_size != uVar8; uVar8 = uVar8 + 1) {
                  idxattr_array[uVar8] = pDVar7->da_idxattr[uVar8];
                  form_array[uVar8] = pDVar7->da_form[uVar8];
                }
                return 0;
              }
              pcVar3 = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
              errval = 0x149;
            }
            else {
              pcVar3 = 
              "DW_DLE_DEBUG_NAMES_ERROR: The entry pool offset from the names table  is out of bounds."
              ;
              errval = 0x1e4;
              pDVar5 = (Dwarf_Debug)0x0;
            }
          }
          else {
            pcVar3 = 
            "DW_DLE_DEBUG_NAMES_ERROR: The entrypool offset read is larger thanthe entrypool size";
            errval = 0x1e4;
          }
        }
      }
      goto LAB_0014ebba;
    }
    pcVar3 = 
    "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head"
    ;
  }
  errval = 0x51;
  pDVar5 = (Dwarf_Debug)0x0;
LAB_0014ebba:
  _dwarf_error_string(pDVar5,error,errval,pcVar3);
  return 1;
}

Assistant:

int
dwarf_dnames_name(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      name_index,
    Dwarf_Unsigned    * bucket_number,
    Dwarf_Unsigned    * hash_value,
    Dwarf_Unsigned    * offset_to_debug_str,
    char *            * ptrtostr ,
    Dwarf_Unsigned    * offset_in_entrypool,
    Dwarf_Unsigned    * abbrev_code,
    Dwarf_Half        * abbrev_tag,
    Dwarf_Unsigned      array_size,
    Dwarf_Half        * idxattr_array,
    Dwarf_Half        * form_array,
    Dwarf_Unsigned    * attr_count,
    Dwarf_Error *       error)
{
    Dwarf_Debug dbg                     = 0;
    int res                             = 0;
    Dwarf_Unsigned entrypooloffset      = 0;
    Dwarf_Unsigned debugstroffset       = 0;
    Dwarf_Small * strpointer            = 0;
    struct Dwarf_D_Abbrev_s *abbrevdata = 0;
    Dwarf_Unsigned code                 = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "Passes in a NULL or uninitialized pointer");
        return DW_DLV_ERROR;
    }
    dbg = dn->dn_dbg;
    if (IS_INVALID_DBG(dbg)) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head");
        return DW_DLV_ERROR;
    }
    if (!name_index || name_index > dn->dn_name_count) {
        return DW_DLV_NO_ENTRY;
    }
    res = get_bucket_number(dn,name_index,bucket_number);
    if (res == DW_DLV_OK) {
        res = get_hash_value_number(dn,name_index,hash_value,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    {
        Dwarf_Small *ptr = dn->dn_string_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;

        READ_UNALIGNED_CK(dbg, debugstroffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (offset_to_debug_str) {
            *offset_to_debug_str = debugstroffset;
        }
    }
    /* Get str ptr from .debug_str */
    {
        Dwarf_Small *secdataptr = 0;
        Dwarf_Unsigned secdatalen = 0;
        Dwarf_Small *secend = 0;
        int res_s = 0;

        secdataptr = (Dwarf_Small *)dbg->de_debug_str.dss_data;
        secdatalen = dbg->de_debug_str.dss_size;
        secend = secdataptr+secdatalen;
        strpointer = secdataptr +debugstroffset;
        res_s = _dwarf_check_string_valid(dbg,
            secdataptr,strpointer,secend,
            DW_DLE_FORM_STRING_BAD_STRING,error);
        if (res_s != DW_DLV_OK) {
            return res_s;
        }
        if (ptrtostr) {
            *ptrtostr = (char *)strpointer;
        }
    }

    {
        Dwarf_Small *ptr = dn->dn_entry_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;
        /*  offsets relative to the start of the
            entry_pool */

        READ_UNALIGNED_CK(dbg, entrypooloffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (entrypooloffset >= dn->dn_entry_pool_size) {
            _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_ERROR,
                "DW_DLE_DEBUG_NAMES_ERROR: "
                "The entrypool offset read is larger than"
                "the entrypool size");
            return DW_DLV_ERROR;
        }
        if (offset_in_entrypool) {
            *offset_in_entrypool = entrypooloffset;
        }
    }
    /*   Find abbrev code at the given entry offset */
    res = _dwarf_read_abbrev_code_from_pool(dn,
        entrypooloffset, &code,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_find_abbrev_for_code(dn,code,&abbrevdata,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }

    if (abbrev_code) {
        *abbrev_code =  code;
    }
    if (code && abbrev_tag) {
        *abbrev_tag =  (Dwarf_Half)abbrevdata->da_tag;
    }
    if (code) {
        if (attr_count) {
            *attr_count = abbrevdata->da_pairs_count;
        }
        res = _dwarf_fill_in_attr_form(dn,abbrevdata,idxattr_array,
            form_array, array_size,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    return DW_DLV_OK;
}